

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-spec-builders.h
# Opt level: O2

Action<unsigned_int_()> * __thiscall
testing::internal::OnCallSpec<unsigned_int_()>::GetAction(OnCallSpec<unsigned_int_()> *this)

{
  int iVar1;
  allocator<char> local_39;
  string local_38;
  
  iVar1 = *(int *)(this + 0xc);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_38,".WillByDefault() must appear exactly once in an ON_CALL().",
             &local_39);
  UntypedOnCallSpecBase::AssertSpecProperty((UntypedOnCallSpecBase *)this,iVar1 == 2,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  return (Action<unsigned_int_()> *)(this + 0x30);
}

Assistant:

const Action<F>& GetAction() const {
    AssertSpecProperty(last_clause_ == kWillByDefault,
                       ".WillByDefault() must appear exactly "
                       "once in an ON_CALL().");
    return action_;
  }